

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall mp::NLSolver::NLSolver(NLSolver *this)

{
  (this->utils_)._vptr_NLUtils = (_func_int **)&PTR__NLUtils_0011ad68;
  (this->utils_).show_fln_ = false;
  this->p_ut_ = &this->utils_;
  (this->pathstr_)._M_dataplus._M_p = (pointer)&(this->pathstr_).field_2;
  (this->pathstr_)._M_string_length = 0;
  (this->pathstr_).field_2._M_local_buf[0] = '\0';
  (this->filestub_)._M_dataplus._M_p = (pointer)&(this->filestub_).field_2;
  (this->filestub_)._M_string_length = 0;
  (this->filestub_).field_2._M_local_buf[0] = '\0';
  this->filestubCustom_ = false;
  (this->p_nlheader_)._M_t.super___uniq_ptr_impl<mp::NLHeader,_std::default_delete<mp::NLHeader>_>.
  _M_t.super__Tuple_impl<0UL,_mp::NLHeader_*,_std::default_delete<mp::NLHeader>_>.
  super__Head_base<0UL,_mp::NLHeader_*,_false>._M_head_impl = (NLHeader *)0x0;
  (this->pd_).vperm_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->pd_).vperm_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->pd_).vperm_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pd_).vperm_inv_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pd_).vperm_inv_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pd_).vperm_inv_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->err_msg_)._M_dataplus._M_p = (pointer)&(this->err_msg_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->err_msg_,"Solving not attempted","");
  this->nl_result_ = NLW2_WriteNL_Unset;
  this->sol_result_ = NLW2_SOLRead_Result_Not_Set;
  return;
}

Assistant:

NLSolver::NLSolver()
  : p_ut_(&utils_) { }